

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

int __thiscall Array<String>::remove(Array<String> *this,char *__filename)

{
  String *pSVar1;
  String *dest;
  String *end;
  String *pos;
  Iterator *it_local;
  Array<String> *this_local;
  
  end = *(String **)__filename;
  pSVar1 = (this->_end).item + -1;
  (this->_end).item = pSVar1;
  while (end < pSVar1) {
    String::operator=(end,end + 1);
    end = end + 1;
  }
  String::~String(end);
  Iterator::Iterator((Iterator *)&this_local,*(String **)__filename);
  return (int)this_local;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    T* pos = it.item;
    for(T* end = --_end.item, * dest; pos < end;)
    {
      dest = pos;
      *dest = *(++pos);
    }
    pos->~T();
    return it.item;
  }